

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

void __thiscall
flatbuffers::JsonPrinter::GenField<signed_char>
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent)

{
  voffset_t field;
  char cVar1;
  bool bVar2;
  char *pcVar3;
  _Optional_payload_base<signed_char> local_2a;
  int local_28;
  Optional<signed_char> opt;
  int indent_local;
  bool fixed_local;
  Table *table_local;
  FieldDef *fd_local;
  JsonPrinter *this_local;
  
  local_28 = indent;
  opt.super__Optional_base<signed_char,_true,_true>._M_payload.
  super__Optional_payload_base<signed_char>._M_engaged = fixed;
  if (fixed) {
    cVar1 = Struct::GetField<signed_char>((Struct *)table,(uint)(fd->value).offset);
    PrintScalar<signed_char>(this,cVar1,&(fd->value).type,local_28);
  }
  else {
    bVar2 = FieldDef::IsOptional(fd);
    if (bVar2) {
      local_2a = (_Optional_payload_base<signed_char>)
                 Table::GetOptional<signed_char,signed_char>(table,(fd->value).offset);
      bVar2 = std::optional::operator_cast_to_bool((optional *)&local_2a);
      if (bVar2) {
        pcVar3 = std::optional<signed_char>::operator*((optional<signed_char> *)&local_2a);
        PrintScalar<signed_char>(this,*pcVar3,&(fd->value).type,local_28);
      }
      else {
        std::__cxx11::string::operator+=((string *)this->text,"null");
      }
    }
    else {
      field = (fd->value).offset;
      cVar1 = GetFieldDefault<signed_char>(fd);
      cVar1 = Table::GetField<signed_char>(table,field,cVar1);
      PrintScalar<signed_char>(this,cVar1,&(fd->value).type,local_28);
    }
  }
  return;
}

Assistant:

void GenField(const FieldDef &fd, const Table *table, bool fixed,
                int indent) {
    if (fixed) {
      PrintScalar(
          reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset),
          fd.value.type, indent);
    } else if (fd.IsOptional()) {
      auto opt = table->GetOptional<T, T>(fd.value.offset);
      if (opt) {
        PrintScalar(*opt, fd.value.type, indent);
      } else {
        text += "null";
      }
    } else {
      PrintScalar(table->GetField<T>(fd.value.offset, GetFieldDefault<T>(fd)),
                  fd.value.type, indent);
    }
  }